

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchFunc.cpp
# Opt level: O1

void Bmatch_PIInformation(Abc_Frame_t *pAbc)

{
  void *pvVar1;
  long lVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int j;
  uint uVar11;
  long lVar12;
  long lVar13;
  int i;
  ulong uVar14;
  int i_1;
  
  pvVar1 = pAbc->pInformation;
  pvVar4 = operator_new__((*(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >> 3) + 1
                         );
  pvVar5 = operator_new__((*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3) + 1
                         );
  *(undefined1 *)
   ((long)pvVar4 + (*(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >> 3)) = 0;
  *(undefined1 *)
   ((long)pvVar5 + (*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3)) = 0;
  uVar14 = 0;
LAB_007b5277:
  uVar8 = *(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >> 3;
  if (uVar8 <= uVar14) {
    if ((ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3) <= uVar14)
    goto LAB_007b5528;
    if (uVar8 <= uVar14) {
      printf("                                     ");
      goto LAB_007b52d3;
    }
  }
  pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(*(long *)(*(long *)((long)pvVar1 + 0x50) + uVar14 * 8) + 8));
  printf("%6s:                              ",pcVar6);
LAB_007b52d3:
  if (uVar14 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >> 3)) {
    pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(*(long *)(*(long *)((long)pvVar1 + 0x68) + uVar14 * 8) + 8)
                        );
    printf("%6s:",pcVar6);
  }
  else {
    printf("       ");
  }
  putchar(10);
  lVar12 = 0;
  do {
    lVar7 = (long)**(int **)(*(long *)((long)pvVar1 + 0x50) + uVar14 * 8);
    if (lVar12 < lVar7) {
LAB_007b534e:
      if (*(long *)((long)pvVar1 + 0x58) != *(long *)((long)pvVar1 + 0x50)) {
        uVar8 = 0;
        do {
          lVar7 = *(long *)((long)pvVar1 + 0x50);
          lVar2 = *(long *)(*(long *)(*(long *)(lVar7 + uVar14 * 8) + 0x10) + lVar12 * 8);
          lVar13 = *(long *)(lVar2 + 0x10);
          if (*(long *)(lVar2 + 0x18) != lVar13) {
            uVar9 = 0;
            do {
              if (*(long *)(lVar13 + uVar9 * 8) == *(long *)(lVar7 + uVar8 * 8)) {
                *(undefined1 *)((long)pvVar4 + uVar8) = 0x31;
              }
              uVar9 = uVar9 + 1;
              lVar7 = *(long *)((long)pvVar1 + 0x50);
              lVar2 = *(long *)(*(long *)(*(long *)(lVar7 + uVar14 * 8) + 0x10) + lVar12 * 8);
              lVar13 = *(long *)(lVar2 + 0x10);
            } while (uVar9 < (ulong)(*(long *)(lVar2 + 0x18) - lVar13 >> 3));
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >>
                                3));
      }
      if (*(long *)((long)pvVar1 + 0x58) != *(long *)((long)pvVar1 + 0x50)) {
        uVar8 = 0;
        do {
          if (*(char *)((long)pvVar4 + uVar8) != '1') {
            *(undefined1 *)((long)pvVar4 + uVar8) = 0x30;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >>
                                3));
      }
      printf("        %28s",pvVar4);
      if (*(long *)((long)pvVar1 + 0x58) != *(long *)((long)pvVar1 + 0x50)) {
        uVar8 = 0;
        do {
          *(undefined1 *)((long)pvVar4 + uVar8) = 0x30;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x58) - *(long *)((long)pvVar1 + 0x50) >>
                                3));
      }
    }
    else {
      if (**(int **)(*(long *)((long)pvVar1 + 0x68) + uVar14 * 8) <= lVar12) goto LAB_007b5520;
      if (lVar12 < lVar7) goto LAB_007b534e;
      printf("                                    ");
    }
    if (lVar12 < **(int **)(*(long *)((long)pvVar1 + 0x68) + uVar14 * 8)) {
      if (*(long *)((long)pvVar1 + 0x70) != *(long *)((long)pvVar1 + 0x68)) {
        uVar8 = 0;
        do {
          lVar7 = *(long *)((long)pvVar1 + 0x68);
          lVar2 = *(long *)(*(long *)(*(long *)(lVar7 + uVar14 * 8) + 0x10) + lVar12 * 8);
          lVar13 = *(long *)(lVar2 + 0x10);
          if (*(long *)(lVar2 + 0x18) != lVar13) {
            uVar9 = 0;
            do {
              if (*(long *)(lVar13 + uVar9 * 8) == *(long *)(lVar7 + uVar8 * 8)) {
                *(undefined1 *)((long)pvVar5 + uVar8) = 0x31;
              }
              uVar9 = uVar9 + 1;
              lVar7 = *(long *)((long)pvVar1 + 0x68);
              lVar2 = *(long *)(*(long *)(*(long *)(lVar7 + uVar14 * 8) + 0x10) + lVar12 * 8);
              lVar13 = *(long *)(lVar2 + 0x10);
            } while (uVar9 < (ulong)(*(long *)(lVar2 + 0x18) - lVar13 >> 3));
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >>
                                3));
      }
      if (*(long *)((long)pvVar1 + 0x70) != *(long *)((long)pvVar1 + 0x68)) {
        uVar8 = 0;
        do {
          if (*(char *)((long)pvVar5 + uVar8) != '1') {
            *(undefined1 *)((long)pvVar5 + uVar8) = 0x30;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >>
                                3));
      }
      printf("        %28s",pvVar5);
      if (*(long *)((long)pvVar1 + 0x70) != *(long *)((long)pvVar1 + 0x68)) {
        uVar8 = 0;
        do {
          *(undefined1 *)((long)pvVar5 + uVar8) = 0x30;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(*(long *)((long)pvVar1 + 0x70) - *(long *)((long)pvVar1 + 0x68) >>
                                3));
      }
    }
    putchar(10);
    lVar12 = lVar12 + 1;
  } while( true );
LAB_007b5528:
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  puts("PI supp information for two circuits : ");
  puts("  cir1   supp     cir2   supp   ");
  uVar14 = 0;
  uVar10 = 0;
  uVar11 = 0;
  do {
    uVar8 = *(long *)((long)pvVar1 + 0x88) - *(long *)((long)pvVar1 + 0x80) >> 3;
    if (uVar14 < uVar8) {
LAB_007b559f:
      piVar3 = *(int **)(*(long *)((long)pvVar1 + 0x80) + uVar14 * 8);
      uVar11 = uVar11 + *piVar3;
      pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(piVar3 + 2));
      printf("%6s%7d   ",pcVar6,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x80) + uVar14 * 8));
    }
    else {
      if ((ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3) <= uVar14) {
        printf(" total %6d    total %6d   \n",(ulong)uVar11,(ulong)uVar10);
        return;
      }
      if (uVar14 < uVar8) goto LAB_007b559f;
      printf("                ");
    }
    if (uVar14 < (ulong)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0x98) >> 3)) {
      piVar3 = *(int **)(*(long *)((long)pvVar1 + 0x98) + uVar14 * 8);
      uVar10 = uVar10 + *piVar3;
      pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(piVar3 + 2));
      printf("%6s%7d",pcVar6,(ulong)**(uint **)(*(long *)((long)pvVar1 + 0x98) + uVar14 * 8));
    }
    else {
      printf("             ");
    }
    putchar(10);
    uVar14 = uVar14 + 1;
  } while( true );
LAB_007b5520:
  uVar14 = uVar14 + 1;
  goto LAB_007b5277;
}

Assistant:

void Bmatch_PIInformation ( Abc_Frame_t * pAbc )
{
    int total1 = 0, total2 = 0;
    PI_PO_INFO *        tmpInformation;
    tmpInformation = (PI_PO_INFO *)pAbc->pInformation;
    char       *        ioInformation1, * ioInformation2;
    ioInformation1 = new char[tmpInformation->_f.size() + 1];
    ioInformation2 = new char[tmpInformation->_g.size() + 1];
    ioInformation1[tmpInformation->_f.size()] = '\0';
    ioInformation2[tmpInformation->_g.size()] = '\0';

        for( int i = 0; i < tmpInformation->_f.size() || i < tmpInformation->_g.size(); ++i ) {
            if( i < tmpInformation->_f.size() )
                printf("%6s:                              ", Abc_ObjName((tmpInformation->_f)[i]->thisObj));
            else
                printf("                                     ");
            if( i < tmpInformation->_g.size() )
                printf("%6s:", Abc_ObjName((tmpInformation->_g)[i]->thisObj));
            else
                printf("       ");
            printf("\n");
            for( int j = 0; j < (tmpInformation->_f)[i]->numOfInfluence || j < (tmpInformation->_g)[i]->numOfInfluence; ++j ) {
                if( j < (tmpInformation->_f)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_f)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_f)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_f)[r] ) {
                                ioInformation1[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        if( ioInformation1[r] != '1' ) {
                            ioInformation1[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation1 );
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        ioInformation1[r] = '0';
                    }
                }
                else printf("                                    ");
                if( j < (tmpInformation->_g)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_g)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_g)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_g)[r] ) {
                                ioInformation2[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        if( ioInformation2[r] != '1' ) {
                            ioInformation2[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation2 );
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        ioInformation2[r] = '0';
                    }
                }
                printf("\n");
            }
        }
    delete [] ioInformation1;
    delete [] ioInformation2;

//
    printf("PI supp information for two circuits : \n");
    printf("  cir1   supp     cir2   supp   \n");
    for( int i = 0; i < tmpInformation->_x.size() || i < tmpInformation->_y.size(); ++i ) {
        if( i < tmpInformation->_x.size() ) {
            total1 += (tmpInformation->_x)[i]->numOfInfluence;
            printf("%6s%7d   ", Abc_ObjName((tmpInformation->_x)[i]->thisObj), \
                                 (tmpInformation->_x)[i]->numOfInfluence );
        }
        else printf("                ");
        if( i < tmpInformation->_y.size() ) {
            total2 += (tmpInformation->_y)[i]->numOfInfluence;
            printf("%6s%7d", Abc_ObjName((tmpInformation->_y)[i]->thisObj), \
                              (tmpInformation->_y)[i]->numOfInfluence );
        }
        else printf("             ");
        printf("\n");
    }
    printf(" total %6d    total %6d   \n", total1, total2 );
}